

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterRegistry.cpp
# Opt level: O0

void Assimp::GetImporterInstanceList
               (vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *out)

{
  vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *pvVar1;
  XFileImporter *this;
  ObjFileImporter *this_00;
  AMFImporter *this_01;
  Discreet3DSImporter *this_02;
  M3DImporter *this_03;
  MD3Importer *this_04;
  MD2Importer *this_05;
  PLYImporter *this_06;
  MDLImporter *this_07;
  ASEImporter *this_08;
  value_type pBVar2;
  SMDImporter *this_09;
  MDCImporter *this_10;
  MD5Importer *this_11;
  STLImporter *this_12;
  LWOImporter *this_13;
  AC3DImporter *this_14;
  BVHLoader *this_15;
  IRRMeshImporter *this_16;
  IRRImporter *this_17;
  B3DImporter *this_18;
  ColladaLoader *this_19;
  TerragenImporter *this_20;
  CSMImporter *this_21;
  UnrealImporter *this_22;
  LWSImporter *this_23;
  OgreImporter *this_24;
  OpenGEXImporter *this_25;
  MS3DImporter *this_26;
  BlenderImporter *this_27;
  Q3BSPFileImporter *this_28;
  IFCImporter *this_29;
  XGLImporter *this_30;
  FBXImporter *this_31;
  AssbinImporter *this_32;
  glTFImporter *this_33;
  glTF2Importer *this_34;
  X3DImporter *this_35;
  MMDImporter *this_36;
  value_type local_1a8;
  MMDImporter *local_1a0;
  X3DImporter *local_198;
  value_type local_190;
  glTF2Importer *local_188;
  glTFImporter *local_180;
  AssbinImporter *local_178;
  FBXImporter *local_170;
  XGLImporter *local_168;
  IFCImporter *local_160;
  value_type local_158;
  Q3BSPFileImporter *local_150;
  BlenderImporter *local_148;
  value_type local_140;
  MS3DImporter *local_138;
  OpenGEXImporter *local_130;
  OgreImporter *local_128;
  LWSImporter *local_120;
  UnrealImporter *local_118;
  CSMImporter *local_110;
  TerragenImporter *local_108;
  ColladaLoader *local_100;
  B3DImporter *local_f8;
  value_type local_f0;
  IRRImporter *local_e8;
  IRRMeshImporter *local_e0;
  BVHLoader *local_d8;
  AC3DImporter *local_d0;
  value_type local_c8;
  value_type local_c0;
  value_type local_b8;
  value_type local_b0;
  value_type local_a8;
  LWOImporter *local_a0;
  STLImporter *local_98;
  MD5Importer *local_90;
  MDCImporter *local_88;
  SMDImporter *local_80;
  value_type local_78;
  ASEImporter *local_70;
  MDLImporter *local_68;
  PLYImporter *local_60;
  MD2Importer *local_58;
  MD3Importer *local_50;
  M3DImporter *local_48;
  Discreet3DSImporter *local_40;
  AMFImporter *local_38;
  ObjFileImporter *local_30 [3];
  XFileImporter *local_18;
  vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *local_10;
  vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *out_local;
  
  local_10 = out;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::reserve(out,0x40);
  pvVar1 = local_10;
  this = (XFileImporter *)operator_new(0x90);
  XFileImporter::XFileImporter(this);
  local_18 = this;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_18);
  pvVar1 = local_10;
  this_00 = (ObjFileImporter *)operator_new(0xb8);
  ObjFileImporter::ObjFileImporter(this_00);
  local_30[0] = this_00;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)local_30);
  pvVar1 = local_10;
  this_01 = (AMFImporter *)operator_new(0xf0);
  AMFImporter::AMFImporter(this_01);
  local_38 = this_01;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_38);
  pvVar1 = local_10;
  this_02 = (Discreet3DSImporter *)operator_new(0xd8);
  Discreet3DSImporter::Discreet3DSImporter(this_02);
  local_40 = this_02;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_40);
  pvVar1 = local_10;
  this_03 = (M3DImporter *)operator_new(0x80);
  M3DImporter::M3DImporter(this_03);
  local_48 = this_03;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_48);
  pvVar1 = local_10;
  this_04 = (MD3Importer *)operator_new(0x150);
  MD3Importer::MD3Importer(this_04);
  local_50 = this_04;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_50);
  pvVar1 = local_10;
  this_05 = (MD2Importer *)operator_new(0x98);
  MD2Importer::MD2Importer(this_05);
  local_58 = this_05;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_58);
  pvVar1 = local_10;
  this_06 = (PLYImporter *)operator_new(0x90);
  PLYImporter::PLYImporter(this_06);
  local_60 = this_06;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_60);
  pvVar1 = local_10;
  this_07 = (MDLImporter *)operator_new(0xd0);
  MDLImporter::MDLImporter(this_07);
  local_68 = this_07;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_68);
  pvVar1 = local_10;
  this_08 = (ASEImporter *)operator_new(0x98);
  ASEImporter::ASEImporter(this_08);
  local_70 = this_08;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_70);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0xd0);
  HMPImporter::HMPImporter((HMPImporter *)pBVar2);
  local_78 = pBVar2;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,&local_78);
  pvVar1 = local_10;
  this_09 = (SMDImporter *)operator_new(0x110);
  SMDImporter::SMDImporter(this_09);
  local_80 = this_09;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_80);
  pvVar1 = local_10;
  this_10 = (MDCImporter *)operator_new(0x98);
  MDCImporter::MDCImporter(this_10);
  local_88 = this_10;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_88);
  pvVar1 = local_10;
  this_11 = (MD5Importer *)operator_new(200);
  MD5Importer::MD5Importer(this_11);
  local_90 = this_11;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_90);
  pvVar1 = local_10;
  this_12 = (STLImporter *)operator_new(0xa0);
  STLImporter::STLImporter(this_12);
  local_98 = this_12;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_98);
  pvVar1 = local_10;
  this_13 = (LWOImporter *)operator_new(0x120);
  LWOImporter::LWOImporter(this_13);
  local_a0 = this_13;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_a0);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x78);
  DXFImporter::DXFImporter((DXFImporter *)pBVar2);
  local_a8 = pBVar2;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,&local_a8);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x78);
  NFFImporter::NFFImporter((NFFImporter *)pBVar2);
  local_b0 = pBVar2;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,&local_b0);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x78);
  RAWImporter::RAWImporter((RAWImporter *)pBVar2);
  local_b8 = pBVar2;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,&local_b8);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x78);
  SIBImporter::SIBImporter((SIBImporter *)pBVar2);
  local_c0 = pBVar2;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,&local_c0);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x78);
  OFFImporter::OFFImporter((OFFImporter *)pBVar2);
  local_c8 = pBVar2;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,&local_c8);
  pvVar1 = local_10;
  this_14 = (AC3DImporter *)operator_new(0xa0);
  AC3DImporter::AC3DImporter(this_14);
  local_d0 = this_14;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_d0);
  pvVar1 = local_10;
  this_15 = (BVHLoader *)operator_new(0xe8);
  BVHLoader::BVHLoader(this_15);
  local_d8 = this_15;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_d8);
  pvVar1 = local_10;
  this_16 = (IRRMeshImporter *)operator_new(0x80);
  IRRMeshImporter::IRRMeshImporter(this_16);
  local_e0 = this_16;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_e0);
  pvVar1 = local_10;
  this_17 = (IRRImporter *)operator_new(0x90);
  IRRImporter::IRRImporter(this_17);
  local_e8 = this_17;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_e8);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x78);
  Q3DImporter::Q3DImporter((Q3DImporter *)pBVar2);
  local_f0 = pBVar2;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,&local_f0);
  pvVar1 = local_10;
  this_18 = (B3DImporter *)operator_new(0x168);
  memset(this_18,0,0x168);
  B3DImporter::B3DImporter(this_18);
  local_f8 = this_18;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_f8);
  pvVar1 = local_10;
  this_19 = (ColladaLoader *)operator_new(0x1a8);
  ColladaLoader::ColladaLoader(this_19);
  local_100 = this_19;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_100);
  pvVar1 = local_10;
  this_20 = (TerragenImporter *)operator_new(0x80);
  TerragenImporter::TerragenImporter(this_20);
  local_108 = this_20;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_108);
  pvVar1 = local_10;
  this_21 = (CSMImporter *)operator_new(0x80);
  CSMImporter::CSMImporter(this_21);
  local_110 = this_21;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_110);
  pvVar1 = local_10;
  this_22 = (UnrealImporter *)operator_new(0x80);
  UnrealImporter::UnrealImporter(this_22);
  local_118 = this_22;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_118);
  pvVar1 = local_10;
  this_23 = (LWSImporter *)operator_new(0xa8);
  LWSImporter::LWSImporter(this_23);
  local_120 = this_23;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_120);
  pvVar1 = local_10;
  this_24 = (OgreImporter *)operator_new(0xd0);
  (this_24->m_textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this_24->m_textures)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_24->m_textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_24->m_textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this_24->m_textures)._M_t._M_impl = 0;
  *(undefined8 *)&(this_24->m_textures)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(undefined8 *)((long)&(this_24->m_userDefinedMaterialLibFile).field_2 + 8) = 0;
  *(undefined8 *)&this_24->m_detectTextureTypeFromFilename = 0;
  (this_24->m_userDefinedMaterialLibFile)._M_string_length = 0;
  (this_24->m_userDefinedMaterialLibFile).field_2._M_allocated_capacity = 0;
  (this_24->super_BaseImporter).m_progress = (ProgressHandler *)0x0;
  *(undefined8 *)&this_24->m_userDefinedMaterialLibFile = 0;
  (this_24->super_BaseImporter).m_ErrorText.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_24->super_BaseImporter).m_ErrorText.field_2 + 8) = 0;
  *(undefined8 *)&(this_24->super_BaseImporter).m_ErrorText = 0;
  (this_24->super_BaseImporter).m_ErrorText._M_string_length = 0;
  (this_24->super_BaseImporter).importerScale = 0.0;
  (this_24->super_BaseImporter).fileScale = 0.0;
  (this_24->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this_24->super_BaseImporter).applicationUnits = 0;
  (this_24->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  (this_24->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = (_Base_ptr)0x0;
  *(undefined8 *)
   &(this_24->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this_24->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (this_24->super_BaseImporter)._vptr_BaseImporter = (_func_int **)0x0;
  *(undefined8 *)&(this_24->super_BaseImporter).importerUnits._M_t._M_impl = 0;
  Ogre::OgreImporter::OgreImporter(this_24);
  local_128 = this_24;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_128);
  pvVar1 = local_10;
  this_25 = (OpenGEXImporter *)operator_new(0x338);
  OpenGEX::OpenGEXImporter::OpenGEXImporter(this_25);
  local_130 = this_25;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_130);
  pvVar1 = local_10;
  this_26 = (MS3DImporter *)operator_new(0x80);
  MS3DImporter::MS3DImporter(this_26);
  local_138 = this_26;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_138);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x78);
  COBImporter::COBImporter((COBImporter *)pBVar2);
  local_140 = pBVar2;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,&local_140);
  pvVar1 = local_10;
  this_27 = (BlenderImporter *)operator_new(0x80);
  BlenderImporter::BlenderImporter(this_27);
  local_148 = this_27;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_148);
  pvVar1 = local_10;
  this_28 = (Q3BSPFileImporter *)operator_new(0xd0);
  Q3BSPFileImporter::Q3BSPFileImporter(this_28);
  local_150 = this_28;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_150);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x78);
  NDOImporter::NDOImporter((NDOImporter *)pBVar2);
  local_158 = pBVar2;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,&local_158);
  pvVar1 = local_10;
  this_29 = (IFCImporter *)operator_new(0x88);
  IFCImporter::IFCImporter(this_29);
  local_160 = this_29;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_160);
  pvVar1 = local_10;
  this_30 = (XGLImporter *)operator_new(0x90);
  XGLImporter::XGLImporter(this_30);
  local_168 = this_30;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_168);
  pvVar1 = local_10;
  this_31 = (FBXImporter *)operator_new(0x88);
  FBXImporter::FBXImporter(this_31);
  local_170 = this_31;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_170);
  pvVar1 = local_10;
  this_32 = (AssbinImporter *)operator_new(0x80);
  (this_32->super_BaseImporter).m_progress = (ProgressHandler *)0x0;
  this_32->shortened = false;
  this_32->compressed = false;
  *(undefined6 *)&this_32->field_0x7a = 0;
  (this_32->super_BaseImporter).m_ErrorText.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_32->super_BaseImporter).m_ErrorText.field_2 + 8) = 0;
  *(undefined8 *)&(this_32->super_BaseImporter).m_ErrorText = 0;
  (this_32->super_BaseImporter).m_ErrorText._M_string_length = 0;
  (this_32->super_BaseImporter).importerScale = 0.0;
  (this_32->super_BaseImporter).fileScale = 0.0;
  (this_32->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this_32->super_BaseImporter).applicationUnits = 0;
  (this_32->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  (this_32->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = (_Base_ptr)0x0;
  *(undefined8 *)
   &(this_32->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this_32->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (this_32->super_BaseImporter)._vptr_BaseImporter = (_func_int **)0x0;
  *(undefined8 *)&(this_32->super_BaseImporter).importerUnits._M_t._M_impl = 0;
  AssbinImporter::AssbinImporter(this_32);
  local_178 = this_32;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_178);
  pvVar1 = local_10;
  this_33 = (glTFImporter *)operator_new(0xb0);
  glTFImporter::glTFImporter(this_33);
  local_180 = this_33;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_180);
  pvVar1 = local_10;
  this_34 = (glTF2Importer *)operator_new(0xb0);
  glTF2Importer::glTF2Importer(this_34);
  local_188 = this_34;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_188);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x78);
  D3MFImporter::D3MFImporter((D3MFImporter *)pBVar2);
  local_190 = pBVar2;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,&local_190);
  pvVar1 = local_10;
  this_35 = (X3DImporter *)operator_new(0xa8);
  X3DImporter::X3DImporter(this_35);
  local_198 = this_35;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_198);
  pvVar1 = local_10;
  this_36 = (MMDImporter *)operator_new(0xb0);
  MMDImporter::MMDImporter(this_36);
  local_1a0 = this_36;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,(value_type *)&local_1a0);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x78);
  StepFile::StepFileImporter::StepFileImporter((StepFileImporter *)pBVar2);
  local_1a8 = pBVar2;
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
            (pvVar1,&local_1a8);
  return;
}

Assistant:

void GetImporterInstanceList(std::vector< BaseImporter* >& out)
{
    // ----------------------------------------------------------------------------
    // Add an instance of each worker class here
    // (register_new_importers_here)
    // ----------------------------------------------------------------------------
    out.reserve(64);
#if (!defined ASSIMP_BUILD_NO_X_IMPORTER)
    out.push_back( new XFileImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_OBJ_IMPORTER)
    out.push_back( new ObjFileImporter());
#endif
#ifndef ASSIMP_BUILD_NO_AMF_IMPORTER
	out.push_back( new AMFImporter() );
#endif
#if (!defined ASSIMP_BUILD_NO_3DS_IMPORTER)
    out.push_back( new Discreet3DSImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_M3D_IMPORTER)
    out.push_back( new M3DImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_MD3_IMPORTER)
    out.push_back( new MD3Importer());
#endif
#if (!defined ASSIMP_BUILD_NO_MD2_IMPORTER)
    out.push_back( new MD2Importer());
#endif
#if (!defined ASSIMP_BUILD_NO_PLY_IMPORTER)
    out.push_back( new PLYImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_MDL_IMPORTER)
    out.push_back( new MDLImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_ASE_IMPORTER)
  #if (!defined ASSIMP_BUILD_NO_3DS_IMPORTER)
    out.push_back( new ASEImporter());
#  endif
#endif
#if (!defined ASSIMP_BUILD_NO_HMP_IMPORTER)
    out.push_back( new HMPImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_SMD_IMPORTER)
    out.push_back( new SMDImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_MDC_IMPORTER)
    out.push_back( new MDCImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_MD5_IMPORTER)
    out.push_back( new MD5Importer());
#endif
#if (!defined ASSIMP_BUILD_NO_STL_IMPORTER)
    out.push_back( new STLImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_LWO_IMPORTER)
    out.push_back( new LWOImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_DXF_IMPORTER)
    out.push_back( new DXFImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_NFF_IMPORTER)
    out.push_back( new NFFImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_RAW_IMPORTER)
    out.push_back( new RAWImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_SIB_IMPORTER)
    out.push_back( new SIBImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_OFF_IMPORTER)
    out.push_back( new OFFImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_AC_IMPORTER)
    out.push_back( new AC3DImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_BVH_IMPORTER)
    out.push_back( new BVHLoader());
#endif
#if (!defined ASSIMP_BUILD_NO_IRRMESH_IMPORTER)
    out.push_back( new IRRMeshImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_IRR_IMPORTER)
    out.push_back( new IRRImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_Q3D_IMPORTER)
    out.push_back( new Q3DImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_B3D_IMPORTER)
    out.push_back( new B3DImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_COLLADA_IMPORTER)
    out.push_back( new ColladaLoader());
#endif
#if (!defined ASSIMP_BUILD_NO_TERRAGEN_IMPORTER)
    out.push_back( new TerragenImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_CSM_IMPORTER)
    out.push_back( new CSMImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_3D_IMPORTER)
    out.push_back( new UnrealImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_LWS_IMPORTER)
    out.push_back( new LWSImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_OGRE_IMPORTER)
    out.push_back( new Ogre::OgreImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_OPENGEX_IMPORTER )
    out.push_back( new OpenGEX::OpenGEXImporter() );
#endif
#if (!defined ASSIMP_BUILD_NO_MS3D_IMPORTER)
    out.push_back( new MS3DImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_COB_IMPORTER)
    out.push_back( new COBImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_BLEND_IMPORTER)
    out.push_back( new BlenderImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_Q3BSP_IMPORTER)
    out.push_back( new Q3BSPFileImporter() );
#endif
#if (!defined ASSIMP_BUILD_NO_NDO_IMPORTER)
    out.push_back( new NDOImporter() );
#endif
#if (!defined ASSIMP_BUILD_NO_IFC_IMPORTER)
    out.push_back( new IFCImporter() );
#endif
#if ( !defined ASSIMP_BUILD_NO_XGL_IMPORTER )
    out.push_back( new XGLImporter() );
#endif
#if ( !defined ASSIMP_BUILD_NO_FBX_IMPORTER )
    out.push_back( new FBXImporter() );
#endif
#if ( !defined ASSIMP_BUILD_NO_ASSBIN_IMPORTER )
    out.push_back( new AssbinImporter() );
#endif
#if ( !defined ASSIMP_BUILD_NO_GLTF_IMPORTER )
    out.push_back( new glTFImporter() );
    out.push_back( new glTF2Importer() );
#endif
#if ( !defined ASSIMP_BUILD_NO_C4D_IMPORTER )
    out.push_back( new C4DImporter() );
#endif
#if ( !defined ASSIMP_BUILD_NO_3MF_IMPORTER )
    out.push_back( new D3MFImporter() );
#endif
#ifndef ASSIMP_BUILD_NO_X3D_IMPORTER
    out.push_back( new X3DImporter() );
#endif
#ifndef ASSIMP_BUILD_NO_MMD_IMPORTER
    out.push_back( new MMDImporter() );
#endif
#ifndef ASSIMP_BUILD_NO_STEP_IMPORTER
    out.push_back(new StepFile::StepFileImporter());
#endif
}